

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb.c
# Opt level: O1

void lgx_rb_del(lgx_rb_t *rbt,lgx_rb_node_t *node)

{
  uintptr_t *puVar1;
  lgx_rb_node_s *plVar2;
  lgx_rb_node_s *plVar3;
  bool bVar4;
  lgx_rb_node_s *plVar5;
  lgx_rb_node_t *plVar6;
  lgx_rb_node_t *plVar7;
  lgx_rb_node_s *__ptr;
  lgx_rb_node_t *plVar8;
  long *plVar9;
  lgx_rb_t *plVar10;
  ulong uVar11;
  lgx_rb_node_s *plVar12;
  uint uVar13;
  lgx_rb_t *plVar14;
  lgx_rb_node_t *plVar15;
  ulong *puVar16;
  ulong uVar17;
  
  plVar12 = node->left;
  plVar2 = node->right;
  plVar5 = plVar2;
  __ptr = node;
  if ((plVar12 != (lgx_rb_node_s *)0x0) && (plVar5 = plVar12, plVar2 != (lgx_rb_node_s *)0x0)) {
    do {
      __ptr = plVar2;
      plVar2 = __ptr->left;
    } while (__ptr->left != (lgx_rb_node_s *)0x0);
    plVar5 = __ptr->right;
  }
  if (__ptr == node) {
    plVar6 = (lgx_rb_node_t *)(__ptr->parent_color & 0xfffffffffffffffc);
    if (plVar5 != (lgx_rb_node_s *)0x0) {
      plVar5->parent_color = (ulong)((uint)plVar5->parent_color & 3) | (ulong)plVar6;
    }
    if (rbt->root == node) {
      rbt->root = plVar5;
    }
    else {
      puVar16 = (ulong *)(node->parent_color & 0xfffffffffffffffc);
      if ((lgx_rb_node_t *)*puVar16 == node) {
        *puVar16 = (ulong)plVar5;
      }
      else {
        puVar16[1] = (ulong)plVar5;
      }
    }
  }
  else {
    plVar12->parent_color = (ulong)((uint)plVar12->parent_color & 3) | (ulong)__ptr;
    __ptr->left = plVar12;
    plVar8 = node->right;
    plVar6 = __ptr;
    if (__ptr != plVar8) {
      plVar6 = (lgx_rb_node_t *)(__ptr->parent_color & 0xfffffffffffffffc);
      if (plVar5 != (lgx_rb_node_s *)0x0) {
        plVar5->parent_color = (ulong)((uint)plVar5->parent_color & 3) | (ulong)plVar6;
      }
      *(lgx_rb_node_s **)(__ptr->parent_color & 0xfffffffffffffffc) = plVar5;
      __ptr->right = plVar8;
      node->right->parent_color = (ulong)((uint)node->right->parent_color & 3) | (ulong)__ptr;
    }
    plVar10 = rbt;
    if (rbt->root != node) {
      plVar9 = (long *)(node->parent_color & 0xfffffffffffffffc);
      plVar10 = (lgx_rb_t *)(plVar9 + ((lgx_rb_node_t *)*plVar9 != node));
    }
    plVar10->root = __ptr;
    uVar11 = node->parent_color & 0xfffffffffffffffc;
    uVar13 = (uint)__ptr->parent_color;
    uVar17 = (ulong)(uVar13 & 3);
    __ptr->parent_color = uVar17 | uVar11;
    __ptr->parent_color =
         uVar17 & 0xfffffffffffffffe | uVar11 | (ulong)((uint)node->parent_color & 1);
    node->parent_color = node->parent_color & 0xfffffffffffffffe | (ulong)(uVar13 & 1);
    __ptr = node;
  }
  if ((__ptr->parent_color & 1) != 0) {
    plVar8 = rbt->root;
    do {
      if ((plVar5 == plVar8) ||
         ((plVar5 != (lgx_rb_node_s *)0x0 && ((plVar5->parent_color & 1) == 0)))) break;
      plVar12 = plVar6->left;
      if (plVar5 == plVar12) {
        plVar12 = plVar6->right;
        if ((plVar12->parent_color & 1) == 0) {
          plVar12->parent_color = plVar12->parent_color | 1;
          *(byte *)&plVar6->parent_color = (byte)plVar6->parent_color & 0xfe;
          plVar2 = plVar12->left;
          plVar6->right = plVar2;
          if (plVar2 != (lgx_rb_node_s *)0x0) {
            plVar2->parent_color = (ulong)((uint)plVar2->parent_color & 3) | (ulong)plVar6;
          }
          plVar12->parent_color =
               (ulong)((uint)plVar12->parent_color & 3) | plVar6->parent_color & 0xfffffffffffffffc;
          plVar2 = plVar12;
          plVar10 = rbt;
          if (plVar8 != plVar6) {
            puVar16 = (ulong *)(plVar6->parent_color & 0xfffffffffffffffc);
            plVar10 = (lgx_rb_t *)(puVar16 + ((lgx_rb_node_t *)*puVar16 != plVar6));
            plVar2 = plVar8;
          }
          plVar8 = plVar2;
          plVar10->root = plVar12;
          plVar12->left = plVar6;
          uVar11 = (ulong)((uint)plVar6->parent_color & 3) | (ulong)plVar12;
          plVar12 = plVar6->right;
          plVar6->parent_color = uVar11;
        }
        plVar7 = plVar12->left;
        if (((plVar7 != (lgx_rb_node_t *)0x0) && ((plVar7->parent_color & 1) == 0)) ||
           ((plVar12->right != (lgx_rb_node_s *)0x0 && ((plVar12->right->parent_color & 1) == 0))))
        {
          if ((plVar12->right == (lgx_rb_node_s *)0x0) || ((plVar12->right->parent_color & 1) != 0))
          {
            if (plVar7 != (lgx_rb_node_t *)0x0) {
              *(byte *)&plVar7->parent_color = (byte)plVar7->parent_color | 1;
            }
            *(byte *)&plVar12->parent_color = (byte)plVar12->parent_color & 0xfe;
            plVar2 = plVar7->right;
            plVar12->left = plVar2;
            if (plVar2 != (lgx_rb_node_s *)0x0) {
              plVar2->parent_color = (ulong)((uint)plVar2->parent_color & 3) | (ulong)plVar12;
            }
            plVar7->parent_color =
                 (ulong)((uint)plVar7->parent_color & 3) |
                 plVar12->parent_color & 0xfffffffffffffffc;
            plVar15 = plVar7;
            plVar10 = rbt;
            if (plVar8 != plVar12) {
              plVar14 = (lgx_rb_t *)(plVar12->parent_color & 0xfffffffffffffffc);
              plVar15 = plVar8;
              plVar10 = (lgx_rb_t *)&plVar14->size;
              if (*(lgx_rb_node_s **)&plVar14->size != plVar12) {
                plVar10 = plVar14;
              }
            }
            plVar8 = plVar15;
            plVar10->root = plVar7;
            plVar7->right = plVar12;
            plVar12->parent_color = (ulong)((uint)plVar12->parent_color & 3) | (ulong)plVar7;
            plVar12 = plVar6->right;
          }
          plVar12->parent_color =
               plVar12->parent_color & 0xfffffffffffffffe | (ulong)((uint)plVar6->parent_color & 1);
          *(byte *)&plVar6->parent_color = (byte)plVar6->parent_color | 1;
          if (plVar12->right != (lgx_rb_node_s *)0x0) {
            puVar1 = &plVar12->right->parent_color;
            *(byte *)puVar1 = (byte)*puVar1 | 1;
          }
          plVar7 = plVar6->right;
          plVar12 = plVar7->left;
          plVar6->right = plVar12;
          if (plVar12 != (lgx_rb_node_s *)0x0) {
            plVar12->parent_color = (ulong)((uint)plVar12->parent_color & 3) | (ulong)plVar6;
          }
          plVar7->parent_color =
               (ulong)((uint)plVar7->parent_color & 3) | plVar6->parent_color & 0xfffffffffffffffc;
          plVar15 = plVar7;
          plVar10 = rbt;
          if (plVar8 != plVar6) {
            puVar16 = (ulong *)(plVar6->parent_color & 0xfffffffffffffffc);
            plVar10 = (lgx_rb_t *)(puVar16 + ((lgx_rb_node_t *)*puVar16 != plVar6));
            plVar15 = plVar8;
          }
          plVar8 = plVar15;
          plVar10->root = plVar7;
          plVar7->left = plVar6;
          goto LAB_00111e35;
        }
LAB_00111e4a:
        *(byte *)&plVar12->parent_color = (byte)plVar12->parent_color & 0xfe;
        plVar7 = (lgx_rb_node_t *)(plVar6->parent_color & 0xfffffffffffffffc);
        bVar4 = true;
        plVar5 = plVar6;
      }
      else {
        if ((plVar12->parent_color & 1) == 0) {
          plVar12->parent_color = plVar12->parent_color | 1;
          *(byte *)&plVar6->parent_color = (byte)plVar6->parent_color & 0xfe;
          plVar2 = plVar12->right;
          plVar6->left = plVar2;
          if (plVar2 != (lgx_rb_node_s *)0x0) {
            plVar2->parent_color = (ulong)((uint)plVar2->parent_color & 3) | (ulong)plVar6;
          }
          plVar12->parent_color =
               (ulong)((uint)plVar12->parent_color & 3) | plVar6->parent_color & 0xfffffffffffffffc;
          plVar2 = plVar12;
          plVar10 = rbt;
          if (plVar8 != plVar6) {
            plVar14 = (lgx_rb_t *)(plVar6->parent_color & 0xfffffffffffffffc);
            plVar2 = plVar8;
            plVar10 = (lgx_rb_t *)&plVar14->size;
            if (*(lgx_rb_node_t **)&plVar14->size != plVar6) {
              plVar10 = plVar14;
            }
          }
          plVar8 = plVar2;
          plVar10->root = plVar12;
          plVar12->right = plVar6;
          uVar11 = (ulong)((uint)plVar6->parent_color & 3) | (ulong)plVar12;
          plVar12 = plVar6->left;
          plVar6->parent_color = uVar11;
        }
        plVar2 = plVar12->right;
        if (((plVar2 == (lgx_rb_node_s *)0x0) || ((plVar2->parent_color & 1) != 0)) &&
           ((plVar12->left == (lgx_rb_node_s *)0x0 || ((plVar12->left->parent_color & 1) != 0))))
        goto LAB_00111e4a;
        if ((plVar12->left == (lgx_rb_node_s *)0x0) || ((plVar12->left->parent_color & 1) != 0)) {
          if (plVar2 != (lgx_rb_node_s *)0x0) {
            *(byte *)&plVar2->parent_color = (byte)plVar2->parent_color | 1;
          }
          *(byte *)&plVar12->parent_color = (byte)plVar12->parent_color & 0xfe;
          plVar3 = plVar2->left;
          plVar12->right = plVar3;
          if (plVar3 != (lgx_rb_node_s *)0x0) {
            plVar3->parent_color = (ulong)((uint)plVar3->parent_color & 3) | (ulong)plVar12;
          }
          plVar2->parent_color =
               (ulong)((uint)plVar2->parent_color & 3) | plVar12->parent_color & 0xfffffffffffffffc;
          plVar3 = plVar2;
          plVar10 = rbt;
          if (plVar8 != plVar12) {
            plVar9 = (long *)(plVar12->parent_color & 0xfffffffffffffffc);
            plVar10 = (lgx_rb_t *)(plVar9 + ((lgx_rb_node_s *)*plVar9 != plVar12));
            plVar3 = plVar8;
          }
          plVar8 = plVar3;
          plVar10->root = plVar2;
          plVar2->left = plVar12;
          plVar12->parent_color = (ulong)((uint)plVar12->parent_color & 3) | (ulong)plVar2;
          plVar12 = plVar6->left;
        }
        plVar12->parent_color =
             plVar12->parent_color & 0xfffffffffffffffe | (ulong)((uint)plVar6->parent_color & 1);
        *(byte *)&plVar6->parent_color = (byte)plVar6->parent_color | 1;
        if (plVar12->left != (lgx_rb_node_s *)0x0) {
          puVar1 = &plVar12->left->parent_color;
          *(byte *)puVar1 = (byte)*puVar1 | 1;
        }
        plVar7 = plVar6->left;
        plVar12 = plVar7->right;
        plVar6->left = plVar12;
        if (plVar12 != (lgx_rb_node_s *)0x0) {
          plVar12->parent_color = (ulong)((uint)plVar12->parent_color & 3) | (ulong)plVar6;
        }
        plVar7->parent_color =
             (ulong)((uint)plVar7->parent_color & 3) | plVar6->parent_color & 0xfffffffffffffffc;
        plVar15 = plVar7;
        plVar10 = rbt;
        if (plVar8 != plVar6) {
          plVar14 = (lgx_rb_t *)(plVar6->parent_color & 0xfffffffffffffffc);
          plVar15 = plVar8;
          plVar10 = (lgx_rb_t *)&plVar14->size;
          if (*(lgx_rb_node_t **)&plVar14->size != plVar6) {
            plVar10 = plVar14;
          }
        }
        plVar10->root = plVar7;
        plVar7->right = plVar6;
        plVar8 = plVar15;
LAB_00111e35:
        plVar6->parent_color = (ulong)((uint)plVar6->parent_color & 3) | (ulong)plVar7;
        bVar4 = false;
        plVar7 = plVar6;
      }
      plVar6 = plVar7;
    } while (bVar4);
    if (plVar5 != (lgx_rb_node_s *)0x0) {
      *(byte *)&plVar5->parent_color = (byte)plVar5->parent_color | 1;
    }
  }
  lgx_str_cleanup(&__ptr->key);
  free(__ptr);
  rbt->size = rbt->size - 1;
  return;
}

Assistant:

void lgx_rb_del(lgx_rb_t * rbt, lgx_rb_node_t * node) {
    lgx_rb_node_t * y = node; // 将要被删除的结点 
    lgx_rb_node_t * x = NULL; // y 的唯一子节点
    lgx_rb_node_t * x_parent = NULL;

    // 这里我们确定了要删除的节点 y，并确定了其唯一字节点 x，注意 x 可能为 NULL
    if (y->left == 0) {             // node has at most one non-null child. y == node.  
        x = y->right;               // x might be null.  
    } else {  
        if (y->right == 0) {        // node has exactly one non-null child.  y == node.  
            x = y->left;            // x is not null.  
        } else {                    // node has two non-null children.  Set y to  
            y = y->right;           //   node's successor.  x might be null.  
            while (y->left != 0) {
                y = y->left;
            }
            x = y->right;
        }
    }

    if (y != node) {                 // relink y in place of z.  y is z's successor  
        // 移动 node 的左子节点，使其成为 y 的左子节点
        rb_set_parent(node->left, y);
        y->left = node->left;

        if (y != node->right) {
            x_parent = rb_parent(y);
            if (x) {
                rb_set_parent(x, rb_parent(y));
            }
            rb_parent(y)->left = x;      // y must be a left child

            y->right = node->right;
            rb_set_parent(node->right, y);
        } else {
            x_parent = y;
        }

        if (rbt->root == node) {
            rbt->root = y;
        } else if (rb_parent(node)->left == node) {
            rb_parent(node)->left = y;
        } else {
            rb_parent(node)->right = y;
        }
        rb_set_parent(y, rb_parent(node));

        // 交换 y 与 node 的颜色
        lgx_rb_color_t tmp = rb_color(y);
        rb_set_color(y, rb_color(node));
        rb_set_color(node, tmp);

        y = node;  
        // y now points to node to be actually deleted  
    } else {                        // y == node
        x_parent = rb_parent(y);  
        if (x) {
            rb_set_parent(x, rb_parent(y));
        }
        if (rbt->root == node) {
            rbt->root = x;  
        } else {
            if (rb_parent(node)->left == node) {
                rb_parent(node)->left = x;  
            } else {
                rb_parent(node)->right = x;
            }
        }
    }

    // 删除黑色结点后，导致黑色缺失，违背性质4,故对树进行调整 
    if( rb_is_black(y) ) {
        while (x != rbt->root && (!x || rb_is_black(x))) {
            if (x == x_parent->left) {
                lgx_rb_node_t* uncle = x_parent->right;
                if(rb_is_red(uncle)) {
                    rb_set_black(uncle);
                    rb_set_red(x_parent);
                    rb_rotate_left(rbt, x_parent);  
                    uncle = x_parent->right;  
                }  
                if ((!uncle->left  || rb_is_black(uncle->left)) &&
                    (!uncle->right || rb_is_black(uncle->right))) {
                    rb_set_red(uncle);
                    x = x_parent;
                    x_parent = rb_parent(x_parent);
                } else {  
                    if (!uncle->right || rb_is_black(uncle->right)) {  
                        if (uncle->left) {
                            rb_set_black(uncle->left);
                        }
                        rb_set_red(uncle);
                        rb_rotate_right(rbt, uncle);
                        uncle = x_parent->right;
                    }
                    rb_set_color(uncle, rb_color(x_parent));
                    rb_set_black(x_parent);
                    if (uncle->right) {
                        rb_set_black(uncle->right);
                    }
                    rb_rotate_left(rbt, x_parent);  
                    break;
                }
            } else {                  // same as above, with right <-> left.  
                lgx_rb_node_t* uncle = x_parent->left;
                if (rb_is_red(uncle)) {
                    rb_set_black(uncle);
                    rb_set_red(x_parent);
                    rb_rotate_right(rbt, x_parent);  
                    uncle = x_parent->left;  
                }
                if ((!uncle->right || rb_is_black(uncle->right)) &&  
                    (!uncle->left  || rb_is_black(uncle->left))) {  
                    rb_set_red(uncle);
                    x = x_parent;  
                    x_parent = rb_parent(x_parent);
                } else {  
                    if (!uncle->left || rb_is_black(uncle->left)) {  
                        if (uncle->right) {
                            rb_set_black(uncle->right);
                        }
                        rb_set_red(uncle);
                        rb_rotate_left(rbt, uncle);  
                        uncle = x_parent->left;  
                    }  
                    rb_set_color(uncle, rb_color(x_parent));
                    rb_set_black(x_parent);
                    if (uncle->left) {
                        rb_set_black(uncle->left);
                    }
                    rb_rotate_right(rbt, x_parent);  
                    break;  
                }  
            }
        }
        if (x) {
            rb_set_black(x);
        }
    }

    /* 删除 y */
    lgx_str_cleanup(&y->key);
    xfree(y);

    rbt->size --;
    
    //lgx_rbtree_print(rbt->root);
    //lgx_log_debug("rbtree delete\n");
}